

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O3

int erkStep_Resize(ARKodeMem ark_mem,N_Vector y0,sunrealtype hscale,sunrealtype t0,
                  ARKVecResizeFn resize,void *resize_data)

{
  void *pvVar1;
  int iVar2;
  long lrw_diff;
  int error_code;
  char *msgfmt;
  int iVar3;
  long lVar4;
  long liw_diff;
  long lVar5;
  sunindextype liw1;
  sunindextype lrw1;
  long local_40;
  long local_38;
  
  pvVar1 = ark_mem->step_mem;
  if (pvVar1 == (void *)0x0) {
    msgfmt = "Time step module memory is NULL.";
    iVar3 = -0x15;
    error_code = -0x15;
    iVar2 = 0x4c3;
LAB_00138c6c:
    arkProcessError(ark_mem,error_code,iVar2,"erkStep_Resize",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep.c"
                    ,msgfmt);
  }
  else {
    iVar3 = 0;
    local_40 = 0;
    local_38 = 0;
    if (y0->ops->nvspace != (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
      N_VSpace(y0,&local_38,&local_40);
    }
    lrw_diff = local_38 - ark_mem->lrw1;
    liw_diff = local_40 - ark_mem->liw1;
    ark_mem->lrw1 = local_38;
    ark_mem->liw1 = local_40;
    if (0 < *(int *)((long)pvVar1 + 0x20)) {
      lVar5 = 0;
      lVar4 = 0;
      do {
        iVar2 = arkResizeVec(ark_mem,resize,resize_data,lrw_diff,liw_diff,y0,
                             (N_Vector *)(*(long *)((long)pvVar1 + 0x10) + lVar5));
        if (iVar2 == 0) {
          msgfmt = "Unable to resize vector";
          iVar3 = -0x14;
          error_code = -0x14;
          iVar2 = 0x100;
          goto LAB_00138c6c;
        }
        lVar4 = lVar4 + 1;
        lVar5 = lVar5 + 8;
      } while (lVar4 < *(int *)((long)pvVar1 + 0x20));
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int erkStep_Resize(ARKodeMem ark_mem, N_Vector y0,
                   SUNDIALS_MAYBE_UNUSED sunrealtype hscale,
                   SUNDIALS_MAYBE_UNUSED sunrealtype t0, ARKVecResizeFn resize,
                   void* resize_data)
{
  ARKodeERKStepMem step_mem;
  sunindextype lrw1, liw1, lrw_diff, liw_diff;
  int i, retval;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Determine change in vector sizes */
  lrw1 = liw1 = 0;
  if (y0->ops->nvspace != NULL) { N_VSpace(y0, &lrw1, &liw1); }
  lrw_diff      = lrw1 - ark_mem->lrw1;
  liw_diff      = liw1 - ark_mem->liw1;
  ark_mem->lrw1 = lrw1;
  ark_mem->liw1 = liw1;

  /* Resize the RHS vectors */
  for (i = 0; i < step_mem->stages; i++)
  {
    if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff, liw_diff, y0,
                      &step_mem->F[i]))
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "Unable to resize vector");
      return (ARK_MEM_FAIL);
    }
  }

  return (ARK_SUCCESS);
}